

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O3

void __thiscall chrono::ChProximityContainerSPH::EndAddProximities(ChProximityContainerSPH *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->lastproximity)._M_node;
  while (p_Var3 != (_List_node_base *)&this->proximitylist) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
      p_Var3 = (this->lastproximity)._M_node;
    }
    p_Var2 = p_Var3->_M_next;
    psVar1 = &(this->proximitylist).
              super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
    (this->lastproximity)._M_node = p_Var2;
    p_Var3 = p_Var2;
  }
  return;
}

Assistant:

void ChProximityContainerSPH::EndAddProximities() {
    // remove proximities that are beyond last proximity
    while (lastproximity != proximitylist.end()) {
        delete (*lastproximity);
        lastproximity = proximitylist.erase(lastproximity);
    }
}